

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sphere_info.cpp
# Opt level: O2

ostream * CGL::Collada::operator<<(ostream *os,SphereInfo *sphere)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(os,"Sphere: ");
  poVar1 = std::operator<<(poVar1,(string *)&(sphere->super_Instance).name);
  poVar1 = std::operator<<(poVar1," (id:");
  poVar1 = std::operator<<(poVar1,(string *)&(sphere->super_Instance).id);
  poVar1 = std::operator<<(poVar1,") [");
  poVar1 = std::operator<<(poVar1," radius=");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,sphere->radius);
  poVar1 = std::operator<<(poVar1," ]");
  return poVar1;
}

Assistant:

std::ostream& operator<<( std::ostream& os, const SphereInfo& sphere ) {
  return os << "Sphere: " << sphere.name << " (id:" << sphere.id << ") ["
            << " radius=" << sphere.radius << " ]";
}